

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void lower_bound_sorted_suite::find_even_last_predicate(void)

{
  int *piVar1;
  int ******ppppppiVar2;
  array<int,_4UL> storage;
  int ******local_50;
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  int *******local_38;
  
  local_48 = 0x2c;
  uStack_44 = 0x21;
  iStack_40 = 0x16;
  uStack_3c = 0xb;
  local_50 = (int ******)&uStack_3c;
  local_38 = (int *******)&uStack_3c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f3,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_50,&local_38)
  ;
  ppppppiVar2 = (int ******)&uStack_44;
  piVar1 = &local_48;
  if (0xb < iStack_40) {
    ppppppiVar2 = (int ******)&uStack_3c;
    piVar1 = &iStack_40;
  }
  local_50 = (int ******)
             (piVar1 + (0xb < *(int *)ppppppiVar2) + (0xb < piVar1[0xb < *(int *)ppppppiVar2]));
  local_38 = (int *******)&uStack_3c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f5,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_50,&local_38)
  ;
  ppppppiVar2 = (int ******)&uStack_44;
  piVar1 = &local_48;
  if (10 < iStack_40) {
    ppppppiVar2 = (int ******)&uStack_3c;
    piVar1 = &iStack_40;
  }
  local_38 = (int *******)&local_38;
  local_50 = (int ******)
             (piVar1 + (10 < *(int *)ppppppiVar2) + (10 < piVar1[10 < *(int *)ppppppiVar2]));
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{})",
             "storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f7,"void lower_bound_sorted_suite::find_even_last_predicate()",&local_50,&local_38)
  ;
  return;
}

Assistant:

void find_even_last_predicate()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{}),
                  storage.end());
}